

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct16_stage5_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  __m128i alVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i alVar12;
  __m128i alVar13;
  undefined1 auVar14 [16];
  
  alVar1 = *x;
  alVar12 = x[1];
  alVar13 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[3]);
  *x = alVar13;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[3]);
  x[3] = alVar1;
  alVar1 = (__m128i)paddsw((undefined1  [16])alVar12,(undefined1  [16])x[2]);
  x[1] = alVar1;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar12,(undefined1  [16])x[2]);
  x[2] = alVar1;
  alVar1 = x[5];
  auVar10._0_12_ = alVar1._0_12_;
  auVar10._12_2_ = alVar1[0]._6_2_;
  auVar10._14_2_ = *(undefined2 *)((long)x[6] + 6);
  auVar8._12_4_ = auVar10._12_4_;
  auVar8._0_10_ = alVar1._0_10_;
  auVar8._10_2_ = *(undefined2 *)((long)x[6] + 4);
  auVar5._10_6_ = auVar8._10_6_;
  auVar5._0_8_ = alVar1[0];
  auVar5._8_2_ = alVar1[0]._4_2_;
  auVar2._8_8_ = auVar5._8_8_;
  auVar2._6_2_ = *(undefined2 *)((long)x[6] + 2);
  auVar2._4_2_ = alVar1[0]._2_2_;
  auVar2._0_2_ = (undefined2)alVar1[0];
  auVar2._2_2_ = (short)x[6][0];
  auVar4._2_2_ = (short)x[6][1];
  auVar4._0_2_ = (short)alVar1[1];
  auVar4._4_2_ = alVar1[1]._2_2_;
  auVar4._6_2_ = *(undefined2 *)((long)x[6] + 10);
  auVar4._8_2_ = alVar1[1]._4_2_;
  auVar4._10_2_ = *(undefined2 *)((long)x[6] + 0xc);
  auVar4._12_2_ = alVar1[1]._6_2_;
  auVar4._14_2_ = *(undefined2 *)((long)x[6] + 0xe);
  auVar7._8_4_ = 0xb50f4b0;
  auVar7._0_8_ = 0xb50f4b00b50f4b0;
  auVar7._12_4_ = 0xb50f4b0;
  auVar10 = pmaddwd(auVar2,auVar7);
  auVar8 = pmaddwd(auVar7,auVar4);
  auVar14._8_4_ = 0xb500b50;
  auVar14._0_8_ = 0xb500b500b500b50;
  auVar14._12_4_ = 0xb500b50;
  auVar2 = pmaddwd(auVar2,auVar14);
  auVar5 = pmaddwd(auVar4,auVar14);
  auVar11._0_4_ = auVar10._0_4_ + in_XMM0_Da >> 0xc;
  auVar11._4_4_ = auVar10._4_4_ + in_XMM0_Db >> 0xc;
  auVar11._8_4_ = auVar10._8_4_ + in_XMM0_Dc >> 0xc;
  auVar11._12_4_ = auVar10._12_4_ + in_XMM0_Dd >> 0xc;
  auVar9._0_4_ = auVar8._0_4_ + in_XMM0_Da >> 0xc;
  auVar9._4_4_ = auVar8._4_4_ + in_XMM0_Db >> 0xc;
  auVar9._8_4_ = auVar8._8_4_ + in_XMM0_Dc >> 0xc;
  auVar9._12_4_ = auVar8._12_4_ + in_XMM0_Dd >> 0xc;
  alVar12 = (__m128i)packssdw(auVar11,auVar9);
  auVar3._0_4_ = auVar2._0_4_ + in_XMM0_Da >> 0xc;
  auVar3._4_4_ = auVar2._4_4_ + in_XMM0_Db >> 0xc;
  auVar3._8_4_ = auVar2._8_4_ + in_XMM0_Dc >> 0xc;
  auVar3._12_4_ = auVar2._12_4_ + in_XMM0_Dd >> 0xc;
  auVar6._0_4_ = auVar5._0_4_ + in_XMM0_Da >> 0xc;
  auVar6._4_4_ = auVar5._4_4_ + in_XMM0_Db >> 0xc;
  auVar6._8_4_ = auVar5._8_4_ + in_XMM0_Dc >> 0xc;
  auVar6._12_4_ = auVar5._12_4_ + in_XMM0_Dd >> 0xc;
  alVar1 = (__m128i)packssdw(auVar3,auVar6);
  x[5] = alVar12;
  x[6] = alVar1;
  alVar1 = x[8];
  alVar12 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0xb]);
  x[8] = alVar12;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0xb]);
  x[0xb] = alVar1;
  alVar1 = x[9];
  alVar12 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[10]);
  x[9] = alVar12;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[10]);
  x[10] = alVar1;
  alVar1 = x[0xc];
  alVar12 = (__m128i)psubsw((undefined1  [16])x[0xf],(undefined1  [16])alVar1);
  x[0xc] = alVar12;
  alVar1 = (__m128i)paddsw((undefined1  [16])x[0xf],(undefined1  [16])alVar1);
  x[0xf] = alVar1;
  alVar1 = x[0xd];
  alVar12 = (__m128i)psubsw((undefined1  [16])x[0xe],(undefined1  [16])alVar1);
  x[0xd] = alVar12;
  alVar1 = (__m128i)paddsw((undefined1  [16])x[0xe],(undefined1  [16])alVar1);
  x[0xe] = alVar1;
  return;
}

Assistant:

static inline void idct16_stage5_sse2(__m128i *x, const int32_t *cospi,
                                      const __m128i __rounding,
                                      int8_t cos_bit) {
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);
}